

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

int __thiscall soplex::SPxSolverBase<double>::init(SPxSolverBase<double> *this,EVP_PKEY_CTX *ctx)

{
  SPxRatioTester<double> *pSVar1;
  SPxStatus SVar2;
  int iVar3;
  Type TVar4;
  Representation RVar5;
  SPxSolverBase<double> *pSVar6;
  double dVar7;
  SPxSolverBase<double> *unaff_retaddr;
  SPxSolverBase<double> *in_stack_00000010;
  SPxSolverBase<double> *in_stack_00000020;
  Desc *in_stack_00000038;
  SPxBasisBase<double> *in_stack_00000040;
  SPxException *anon_var_0;
  SPxSolverBase<double> *in_stack_00000070;
  undefined4 in_stack_ffffffffffffff78;
  SPxStatus in_stack_ffffffffffffff7c;
  SPxSolverBase<double> *in_stack_ffffffffffffff80;
  double dVar8;
  SPxSolverBase<double> *in_stack_ffffffffffffff88;
  SPxSolverBase<double> *in_stack_ffffffffffffff90;
  SPxSolverBase<double> *in_stack_ffffffffffffffb0;
  SPxSolverBase<double> *in_stack_ffffffffffffffe0;
  
  if ((this->initialized & 1U) == 0) {
    this->initialized = true;
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x88])();
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x79])();
    SVar2 = SPxBasisBase<double>::status(&this->super_SPxBasisBase<double>);
    if ((SVar2 < SINGULAR) ||
       (pSVar6 = SPxBasisBase<double>::solver(&this->super_SPxBasisBase<double>), pSVar6 != this)) {
      SPxBasisBase<double>::load
                ((SPxBasisBase<double> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 SUB81((ulong)in_stack_ffffffffffffff80 >> 0x38,0));
    }
    this->initialized = false;
  }
  if (((this->super_SPxBasisBase<double>).matrixIsSetup & 1U) == 0) {
    SPxBasisBase<double>::desc(&this->super_SPxBasisBase<double>);
    SPxBasisBase<double>::loadDesc(in_stack_00000040,in_stack_00000038);
  }
  SVar2 = SPxBasisBase<double>::status(&this->super_SPxBasisBase<double>);
  pSVar6 = (SPxSolverBase<double> *)(ulong)(uint)SVar2;
  if (SVar2 != SINGULAR) {
    iVar3 = dim((SPxSolverBase<double> *)0x254a1d);
    if (iVar3 == 0) {
      (this->super_SPxBasisBase<double>).factorized = true;
    }
    if (((this->super_SPxBasisBase<double>).factorized & 1U) == 0) {
      SPxBasisBase<double>::factorize(in_stack_00000040);
    }
    this->m_numCycle = 0;
    TVar4 = type(this);
    if (TVar4 == ENTER) {
      RVar5 = rep(this);
      if (RVar5 == COLUMN) {
        setPrimalBounds(in_stack_ffffffffffffff90);
        setBasisStatus(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      }
      else {
        setDualRowBounds(in_stack_ffffffffffffffb0);
        setBasisStatus(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      }
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x8d])();
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7c])();
      dim((SPxSolverBase<double> *)0x254b5e);
      DIdxSet::setMax((DIdxSet *)in_stack_ffffffffffffff90,
                      (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      coDim((SPxSolverBase<double> *)0x254b82);
      DIdxSet::setMax((DIdxSet *)in_stack_ffffffffffffff90,
                      (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      dim((SPxSolverBase<double> *)0x254ba6);
      DataArray<int>::reSize((DataArray<int> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      coDim((SPxSolverBase<double> *)0x254bca);
      DataArray<int>::reSize((DataArray<int> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      pSVar1 = this->theratiotester;
      entertol((SPxSolverBase<double> *)
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      (*pSVar1->_vptr_SPxRatioTester[4])();
    }
    else {
      RVar5 = rep(this);
      if (RVar5 == ROW) {
        setPrimalBounds(in_stack_ffffffffffffff90);
        setBasisStatus(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      }
      else {
        setDualColBounds(in_stack_ffffffffffffffe0);
        setBasisStatus(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      }
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x8e])();
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7d])();
      in_stack_ffffffffffffff90 = (SPxSolverBase<double> *)&this->infeasibilities;
      dim((SPxSolverBase<double> *)0x254c73);
      DIdxSet::setMax((DIdxSet *)in_stack_ffffffffffffff90,
                      (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      dim((SPxSolverBase<double> *)0x254c97);
      DataArray<int>::reSize((DataArray<int> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      pSVar1 = this->theratiotester;
      leavetol((SPxSolverBase<double> *)
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      (*pSVar1->_vptr_SPxRatioTester[4])();
    }
    SPxBasisBase<double>::coSolve
              ((SPxBasisBase<double> *)in_stack_ffffffffffffff90,
               (VectorBase<double> *)in_stack_ffffffffffffff88,
               (VectorBase<double> *)in_stack_ffffffffffffff80);
    computePvec(in_stack_ffffffffffffff90);
    computeFrhs(in_stack_00000020);
    SPxBasisBase<double>::solve
              ((SPxBasisBase<double> *)in_stack_ffffffffffffff90,
               (VectorBase<double> *)in_stack_ffffffffffffff88,
               (VectorBase<double> *)in_stack_ffffffffffffff80);
    this->theShift = 0.0;
    TVar4 = type(this);
    if (TVar4 == ENTER) {
      shiftFvec(in_stack_00000020);
      dVar8 = this->theShift;
      dVar7 = entertol((SPxSolverBase<double> *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      this->lastShift = dVar8 + dVar7;
      computeCoTest(unaff_retaddr);
      computeTest(unaff_retaddr);
    }
    else {
      shiftPvec(in_stack_00000070);
      dVar8 = this->theShift;
      dVar7 = leavetol((SPxSolverBase<double> *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      this->lastShift = dVar8 + dVar7;
      computeFtest(in_stack_00000010);
    }
    pSVar6 = this;
    if ((this->initialized & 1U) == 0) {
      (*this->thepricer->_vptr_SPxPricer[1])();
      (*this->theratiotester->_vptr_SPxRatioTester[1])();
      this->initialized = true;
    }
  }
  return (int)pSVar6;
}

Assistant:

void SPxSolverBase<R>::init()
   {

      assert(thepricer      != nullptr);
      assert(theratiotester != nullptr);

      if(!initialized)
      {
         initialized = true;
         clearUpdateVecs();
         reDim();

         if(SPxBasisBase<R>::status() <= SPxBasisBase<R>::NO_PROBLEM || this->solver() != this)
            SPxBasisBase<R>::load(this);

         initialized = false;
      }

      if(!this->matrixIsSetup)
         SPxBasisBase<R>::loadDesc(this->desc());

      // Inna/Tobi: don't "upgrade" a singular basis to a regular one
      if(SPxBasisBase<R>::status() == SPxBasisBase<R>::SINGULAR)
         return;

      // catch pathological case for LPs with zero constraints
      if(dim() == 0)
      {
         this->factorized = true;
      }

      // we better factorize explicitly before solving
      if(!this->factorized)
      {
         try
         {
            SPxBasisBase<R>::factorize();
         }
         catch(const SPxException&)
         {
            // reload inital slack basis in case the factorization failed
            assert(SPxBasisBase<R>::status() <= SPxBasisBase<R>::SINGULAR);
            SPxBasisBase<R>::restoreInitialBasis();
            SPxBasisBase<R>::factorize();
            assert(this->factorized);
         }
      }

      m_numCycle = 0;

      if(type() == ENTER)
      {
         if(rep() == COLUMN)
         {
            setPrimalBounds();
            setBasisStatus(SPxBasisBase<R>::PRIMAL);
         }
         else
         {
            setDualRowBounds();
            setBasisStatus(SPxBasisBase<R>::DUAL);
         }

         setEnterBounds();
         computeEnterCoPrhs();
         // prepare support vectors for sparse pricing
         infeasibilities.setMax(dim());
         infeasibilitiesCo.setMax(coDim());
         isInfeasible.reSize(dim());
         isInfeasibleCo.reSize(coDim());
         theratiotester->setDelta(entertol());
      }
      else
      {
         if(rep() == ROW)
         {
            setPrimalBounds();
            setBasisStatus(SPxBasisBase<R>::PRIMAL);
         }
         else
         {
            setDualColBounds();
            setBasisStatus(SPxBasisBase<R>::DUAL);
         }

         setLeaveBounds();
         computeLeaveCoPrhs();
         // prepare support vectors for sparse pricing
         infeasibilities.setMax(dim());
         isInfeasible.reSize(dim());
         theratiotester->setDelta(leavetol());
      }

      SPxBasisBase<R>::coSolve(*theCoPvec, *theCoPrhs);
      computePvec();
      computeFrhs();
      SPxBasisBase<R>::solve(*theFvec, *theFrhs);

      theShift = 0.0;

      if(type() == ENTER)
      {
         shiftFvec();
         lastShift = theShift + entertol();

         computeCoTest();
         computeTest();
      }
      else
      {
         shiftPvec();
         lastShift = theShift + leavetol();

         computeFtest();
      }

      if(!initialized)
      {
         // if(thepricer->solver() != this)
         thepricer->load(this);
         // if(theratiotester->solver() != this)
         theratiotester->load(this);
         initialized = true;
      }
   }